

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_http_parser.c
# Opt level: O2

int mk_http_parser_chunked_decode
              (mk_http_parser *p,char *buf_request,size_t buf_request_len,char **out_buf,
              size_t *out_buf_size)

{
  size_t size;
  int iVar1;
  size_t *psVar2;
  char *out_buf_00;
  int iVar3;
  size_t tmp_written_bytes;
  char **local_40;
  size_t *local_38;
  
  tmp_written_bytes = 0;
  psVar2 = &p->chunk_total_size_received;
  if ((p->header_transfer_encoding & 1) == 0) {
    psVar2 = (size_t *)&p->header_content_length;
  }
  size = *psVar2;
  iVar3 = -1;
  if (size != 0) {
    local_40 = out_buf;
    local_38 = out_buf_size;
    out_buf_00 = (char *)mk_mem_alloc(size);
    if (out_buf_00 != (char *)0x0) {
      iVar1 = mk_http_parser_chunked_decode_buf
                        (p,buf_request,buf_request_len,out_buf_00,size,&tmp_written_bytes);
      if (iVar1 == -1) {
        free(out_buf_00);
      }
      else {
        *local_40 = out_buf_00;
        *local_38 = tmp_written_bytes;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int mk_http_parser_chunked_decode(struct mk_http_parser *p,
                                    char *buf_request, size_t buf_request_len,
                                    char **out_buf, size_t *out_buf_size)
{
    int ret;
    char *tmp_buf;
    size_t tmp_buf_size = 0;
    size_t tmp_written_bytes = 0;

    tmp_buf_size = mk_http_parser_content_length(p);
    if (tmp_buf_size == 0) {
        return -1;
    }

    tmp_buf = mk_mem_alloc(tmp_buf_size);
    if (!tmp_buf) {
        return -1;
    }

    ret = mk_http_parser_chunked_decode_buf(p,
                                            buf_request, buf_request_len,
                                            tmp_buf, tmp_buf_size, &tmp_written_bytes);
    if (ret == -1) {
        mk_mem_free(tmp_buf);
        return -1;
    }

    *out_buf = tmp_buf;
    *out_buf_size = tmp_written_bytes;

    return 0;
}